

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Grid.h
# Opt level: O2

TV __thiscall Nova::Grid<float,_3>::Center(Grid<float,_3> *this,T_INDEX *index)

{
  Vector<int,_3,_true> *in_RDX;
  Vector<float,_3,_true> *data_copy_2;
  undefined8 extraout_XMM0_Qa;
  float in_XMM1_Da;
  TV TVar1;
  Vector<float,_3,_true> data_copy;
  Vector<float,_3,_true> data_copy_1;
  Vector<float,_3,_true> local_48;
  Vector<float,_3,_true> local_38;
  Vector<float,_3,_true> local_2c;
  
  Vector<float,_3,_true>::Vector<int>(&local_2c,in_RDX);
  local_48._data._M_elems[2] = local_2c._data._M_elems[2];
  local_48._data._M_elems[0] = local_2c._data._M_elems[0];
  local_48._data._M_elems[1] = local_2c._data._M_elems[1];
  Vector<float,_3,_true>::operator-=(&local_48,0.5);
  local_38._data._M_elems[0] = local_48._data._M_elems[0];
  local_38._data._M_elems[1] = local_48._data._M_elems[1];
  local_38._data._M_elems[2] = local_48._data._M_elems[2];
  Vector<float,_3,_true>::operator*=(&local_38,(Vector<float,_3,_true> *)(index + 3));
  *(undefined8 *)(this->counts)._data._M_elems = *(undefined8 *)index[1]._data._M_elems;
  (this->counts)._data._M_elems[2] = index[1]._data._M_elems[2];
  Vector<float,_3,_true>::operator+=((Vector<float,_3,_true> *)this,&local_38);
  TVar1._data._M_elems[2] = in_XMM1_Da;
  TVar1._data._M_elems[0] = (float)(int)extraout_XMM0_Qa;
  TVar1._data._M_elems[1] = (float)(int)((ulong)extraout_XMM0_Qa >> 0x20);
  return (TV)TVar1._data._M_elems;
}

Assistant:

TV Center(const T_INDEX& index) const
    {
        return domain.min_corner+(TV(index)-(T).5)*dX;
    }